

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> * __thiscall
Shell::Options::getSimilarOptionNames(Options *this,string *name,bool is_short)

{
  bool bVar1;
  AbstractOptionValue *pAVar2;
  ulong uVar3;
  long lVar4;
  size_t sVar5;
  byte in_CL;
  string *in_RDX;
  string *psVar6;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_RDI;
  VirtualIterator<Shell::Options::AbstractOptionValue_*> options;
  size_t dif;
  AbstractOptionValue *opt;
  string opt_name;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *similar_names;
  size_t in_stack_ffffffffffffff70;
  Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff78;
  ulong local_80;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Stack(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  LookupWrapper::values((LookupWrapper *)0x59f8d9);
  while (bVar1 = Lib::VirtualIterator<Shell::Options::AbstractOptionValue_*>::hasNext
                           ((VirtualIterator<Shell::Options::AbstractOptionValue_*> *)0x59f8e7),
        bVar1) {
    pAVar2 = Lib::VirtualIterator<Shell::Options::AbstractOptionValue_*>::next
                       ((VirtualIterator<Shell::Options::AbstractOptionValue_*> *)0x59f8fc);
    if ((in_CL & 1) == 0) {
      psVar6 = (string *)&pAVar2->longName;
    }
    else {
      psVar6 = (string *)&pAVar2->shortName;
    }
    std::__cxx11::string::string((string *)&local_68,psVar6);
    local_80 = 2;
    if ((in_CL & 1) == 0) {
      uVar3 = std::__cxx11::string::size();
      local_80 = (uVar3 >> 2) + 2;
    }
    lVar4 = std::__cxx11::string::size();
    if ((lVar4 != 0) && (sVar5 = Lib::StringUtils::distance(in_RDX,&local_68), sVar5 < local_80)) {
      std::__cxx11::string::string((string *)&local_48,(string *)&local_68);
      Lib::Stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      push(in_RDI,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
    }
    std::__cxx11::string::~string((string *)&local_68);
  }
  Lib::VirtualIterator<Shell::Options::AbstractOptionValue_*>::~VirtualIterator
            ((VirtualIterator<Shell::Options::AbstractOptionValue_*> *)0x59fa24);
  return in_RDI;
}

Assistant:

Stack<std::string> Options::getSimilarOptionNames(std::string name, bool is_short) const {

  Stack<std::string> similar_names;

  VirtualIterator<AbstractOptionValue*> options = _lookup.values();
  while(options.hasNext()){
    AbstractOptionValue* opt = options.next();
    std::string opt_name = is_short ? opt->shortName : opt->longName;
    size_t dif = 2;
    if(!is_short) dif += name.size()/4;
    if(name.size()!=0 && StringUtils::distance(name,opt_name) < dif)
      similar_names.push(opt_name);
  }

  return similar_names;
}